

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O3

char * __thiscall google::protobuf::Api::_InternalParse(Api *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  int iVar2;
  bool bVar3;
  SourceContext *msg;
  Option *msg_00;
  Method *msg_01;
  Mixin *msg_02;
  ArenaStringPtr *field_name;
  Rep *pRVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  Arena *pAVar8;
  UnknownFieldSet *unknown;
  byte *p;
  internal *this_03;
  char cVar9;
  uint uVar10;
  string *psVar11;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  StringPiece str;
  byte *local_38;
  char *size;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->version_;
  this_02 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    uVar10 = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      uVar10 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar12 = internal::ReadTagFallback((char *)local_38,uVar10);
        p = (byte *)pVar12.first;
        if (p == (byte *)0x0) {
          return (char *)0x0;
        }
        uVar10 = pVar12.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    cVar9 = (char)uVar10;
    local_38 = p;
    switch(uVar10 >> 3) {
    case 1:
      if (cVar9 != '\n') break;
      pAVar8 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      psVar11 = this_02->ptr_;
      field_name = this_02;
      if (psVar11 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_02,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar11 = this_02->ptr_;
      }
      local_38 = (byte *)internal::InlineGreedyStringParser(psVar11,(char *)local_38,ctx);
      this_03 = (internal *)(psVar11->_M_dataplus)._M_p;
      size = (char *)psVar11->_M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      pcVar5 = "google.protobuf.Api.name";
LAB_00208f28:
      str.length_ = (stringpiece_ssize_type)pcVar5;
      str.ptr_ = size;
      bVar3 = internal::VerifyUTF8(this_03,str,(char *)field_name);
      if (!bVar3) {
        return (char *)0x0;
      }
      cVar9 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      goto LAB_00209124;
    case 2:
      if (cVar9 == '\x12') {
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar4 = (this->methods_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
            iVar7 = (this->methods_).super_RepeatedPtrFieldBase.total_size_;
LAB_00208f72:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->methods_).super_RepeatedPtrFieldBase,iVar7 + 1);
            pRVar4 = (this->methods_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = pRVar4->allocated_size;
LAB_00208f83:
            pRVar4->allocated_size = iVar7 + 1;
            msg_01 = Arena::CreateMaybeMessage<google::protobuf::Method>
                               ((this->methods_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->methods_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = (this->methods_).super_RepeatedPtrFieldBase.current_size_;
            (this->methods_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            pRVar4->elements[iVar7] = msg_01;
          }
          else {
            iVar2 = (this->methods_).super_RepeatedPtrFieldBase.current_size_;
            iVar7 = pRVar4->allocated_size;
            if (iVar7 <= iVar2) {
              if (iVar7 == (this->methods_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00208f72;
              goto LAB_00208f83;
            }
            (this->methods_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_01 = (Method *)pRVar4->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Method>
                                       (ctx,msg_01,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x12));
LAB_002090d8:
        cVar9 = '\x02';
        goto LAB_00209124;
      }
      break;
    case 3:
      if (cVar9 == '\x1a') {
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar4 = (this->options_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
            iVar7 = (this->options_).super_RepeatedPtrFieldBase.total_size_;
LAB_00208e1b:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->options_).super_RepeatedPtrFieldBase,iVar7 + 1);
            pRVar4 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = pRVar4->allocated_size;
LAB_00208e2c:
            pRVar4->allocated_size = iVar7 + 1;
            msg_00 = Arena::CreateMaybeMessage<google::protobuf::Option>
                               ((this->options_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            pRVar4->elements[iVar7] = msg_00;
          }
          else {
            iVar2 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            iVar7 = pRVar4->allocated_size;
            if (iVar7 <= iVar2) {
              if (iVar7 == (this->options_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00208e1b;
              goto LAB_00208e2c;
            }
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_00 = (Option *)pRVar4->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Option>
                                       (ctx,msg_00,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x1a));
        goto LAB_002090d8;
      }
      break;
    case 4:
      if (cVar9 == '\"') {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        psVar11 = this_01->ptr_;
        field_name = this_01;
        if (psVar11 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_01,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar11 = this_01->ptr_;
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar11,(char *)local_38,ctx);
        this_03 = (internal *)(psVar11->_M_dataplus)._M_p;
        size = (char *)psVar11->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar5 = "google.protobuf.Api.version";
        goto LAB_00208f28;
      }
      break;
    case 5:
      if (cVar9 != '*') break;
      msg = this->source_context_;
      if (msg == (SourceContext *)0x0) {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        msg = Arena::CreateMaybeMessage<google::protobuf::SourceContext>(pAVar8);
        this->source_context_ = msg;
      }
      local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::SourceContext>
                                   (ctx,msg,(char *)local_38);
      goto LAB_00209118;
    case 6:
      if (cVar9 == '2') {
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar4 = (this->mixins_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
            iVar7 = (this->mixins_).super_RepeatedPtrFieldBase.total_size_;
LAB_0020901f:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->mixins_).super_RepeatedPtrFieldBase,iVar7 + 1);
            pRVar4 = (this->mixins_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = pRVar4->allocated_size;
LAB_00209030:
            pRVar4->allocated_size = iVar7 + 1;
            msg_02 = Arena::CreateMaybeMessage<google::protobuf::Mixin>
                               ((this->mixins_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->mixins_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = (this->mixins_).super_RepeatedPtrFieldBase.current_size_;
            (this->mixins_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            pRVar4->elements[iVar7] = msg_02;
          }
          else {
            iVar2 = (this->mixins_).super_RepeatedPtrFieldBase.current_size_;
            iVar7 = pRVar4->allocated_size;
            if (iVar7 <= iVar2) {
              if (iVar7 == (this->mixins_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0020901f;
              goto LAB_00209030;
            }
            (this->mixins_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_02 = (Mixin *)pRVar4->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Mixin>
                                       (ctx,msg_02,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x32));
        goto LAB_002090d8;
      }
      break;
    case 7:
      if (cVar9 == '8') {
        uVar6 = (ulong)(char)*p;
        local_38 = p + 1;
        if ((long)uVar6 < 0) {
          uVar10 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
          if (-1 < (char)*local_38) {
            uVar6 = (ulong)uVar10;
            local_38 = p + 2;
            goto LAB_002090d0;
          }
          local_38 = p;
          pVar13 = internal::VarintParseSlow64((char *)p,uVar10);
          iVar7 = (int)pVar13.second;
          local_38 = (byte *)pVar13.first;
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_002090d0:
          iVar7 = (int)uVar6;
        }
        this->syntax_ = iVar7;
        goto LAB_002090d8;
      }
    }
    if ((uVar10 == 0) || ((uVar10 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
      return (char *)p;
    }
    if (((ulong)this_00->ptr_ & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    local_38 = (byte *)internal::UnknownFieldParse((ulong)uVar10,unknown,(char *)local_38,ctx);
LAB_00209118:
    cVar9 = '\x02';
    if (local_38 == (byte *)0x0) {
      return (char *)0x0;
    }
LAB_00209124:
    if (cVar9 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Api::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Api.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Method methods = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_methods(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Option options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_options(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // string version = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          auto str = _internal_mutable_version();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Api.version"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.SourceContext source_context = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_context(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Mixin mixins = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_mixins(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Syntax syntax = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_syntax(static_cast<PROTOBUF_NAMESPACE_ID::Syntax>(val));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}